

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.h
# Opt level: O0

void __thiscall HighsHessian::HighsHessian(HighsHessian *this)

{
  long in_RDI;
  HighsHessian *this_00;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49bf90);
  this_00 = (HighsHessian *)(in_RDI + 0x20);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49bfa3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49bfb6);
  clear(this_00);
  return;
}

Assistant:

HighsHessian() { clear(); }